

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O1

ushort Memory::ValidPointers<MediumAllocationBlockAttributes>::CalculateAddressIndex
                 (uint index,uint indexPerObject,uint maxObjectIndex)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  ushort uVar4;
  uint uVar5;
  undefined8 *in_FS_OFFSET;
  
  if (0x7ff < index) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                       ,0x5c,"(index < TBlockAttributes::MaxSmallObjectCount)",
                       "index < TBlockAttributes::MaxSmallObjectCount");
    if (!bVar3) goto LAB_00243752;
    *puVar1 = 0;
  }
  uVar4 = 0xffff;
  if (index < maxObjectIndex) {
    uVar5 = (uint)((ulong)index / (ulong)indexPerObject);
    if (0xfffe < uVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                         ,0x62,"(addressIndex < (32767 * 2 + 1))","addressIndex < USHRT_MAX");
      if (!bVar3) {
LAB_00243752:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar1 = 0;
    }
    uVar4 = 0xffff;
    if (indexPerObject * uVar5 == index) {
      uVar4 = (ushort)((ulong)index / (ulong)indexPerObject);
    }
  }
  return uVar4;
}

Assistant:

ushort ValidPointers<TBlockAttributes>::CalculateAddressIndex(uint index, uint indexPerObject, uint maxObjectIndex)
{
    Assert(index < TBlockAttributes::MaxSmallObjectCount);
    if (index >= maxObjectIndex)
    {
        return (ushort)-1;
    }
    uint addressIndex = index / indexPerObject;
    Assert(addressIndex < USHRT_MAX);
    if (addressIndex * indexPerObject != index)
    {
        return (ushort)-1;
    }
    return (ushort)addressIndex;
}